

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O3

int run_test_condvar_5(void)

{
  uv_mutex_t *puVar1;
  short sVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int extraout_EAX_02;
  long lVar6;
  long lVar7;
  undefined8 uVar8;
  short *psVar9;
  ulong uVar10;
  undefined1 *puVar11;
  code *pcVar12;
  char *pcVar13;
  uv_connect_t *puVar14;
  uv_tcp_t *puVar15;
  bool bVar16;
  worker_config_conflict wc;
  undefined1 auStack_410 [16];
  undefined1 auStack_400 [16];
  code *pcStack_3f0;
  code *pcStack_3e8;
  code *pcStack_3e0;
  code *pcStack_3d8;
  undefined1 auStack_3c4 [16];
  undefined1 auStack_3b4 [28];
  int aiStack_398 [24];
  long alStack_338 [31];
  undefined1 auStack_240 [96];
  undefined1 auStack_1e0 [248];
  long lStack_e8;
  ulong uStack_e0;
  worker_config_conflict wStack_d8;
  
  uStack_e0 = 0x14d4f3;
  worker_config_init(&wStack_d8,0,(signal_func)0x0,(wait_func)0x0);
  puVar1 = &wStack_d8.mutex;
  uStack_e0 = 0x14d500;
  uv_mutex_lock(puVar1);
  uStack_e0 = 0x14d505;
  lVar6 = uv_hrtime();
  uStack_e0 = 0x14d51a;
  uVar3 = uv_cond_timedwait(&wStack_d8.cond,puVar1,100000000);
  uStack_e0 = 0x14d521;
  lVar7 = uv_hrtime();
  uStack_e0 = 0x14d52c;
  uv_mutex_unlock(puVar1);
  if (uVar3 == 0xffffff92) {
    if ((ulong)(lVar7 - lVar6) < 75000000) goto LAB_0014d563;
    if ((ulong)(lVar7 - lVar6) < 0x1dcd6501) {
      uStack_e0 = 0x14d54e;
      worker_config_destroy(&wStack_d8);
      return 0;
    }
  }
  else {
    uStack_e0 = 0x14d563;
    run_test_condvar_5_cold_1();
LAB_0014d563:
    uStack_e0 = 0x14d568;
    run_test_condvar_5_cold_2();
  }
  uStack_e0 = 0x14d56d;
  run_test_condvar_5_cold_3();
  pcStack_3d8 = (code *)0x14d57e;
  lStack_e8 = lVar6;
  uStack_e0 = (ulong)uVar3;
  uVar8 = uv_default_loop();
  iVar5 = (int)auStack_1e0;
  pcStack_3d8 = (code *)0x14d591;
  iVar4 = uv_tcp_init(uVar8);
  if (iVar4 == 0) {
    iVar5 = 0x23a3;
    pcStack_3d8 = (code *)0x14d5af;
    iVar4 = uv_ip4_addr("0.0.0.0",0x23a3,auStack_3c4);
    if (iVar4 != 0) goto LAB_0014d6bf;
    puVar11 = auStack_1e0;
    pcStack_3d8 = (code *)0x14d5d8;
    iVar4 = uv_tcp_connect(auStack_240,puVar11,auStack_3c4,connect_4);
    iVar5 = (int)puVar11;
    if (iVar4 != 0) goto LAB_0014d6c4;
    pcStack_3d8 = (code *)0x14d5f2;
    iVar5 = uv_interface_addresses(alStack_338);
    if (iVar5 != 0) {
LAB_0014d5f6:
      iVar5 = 0;
      pcStack_3d8 = (code *)0x14d600;
      iVar4 = uv_run(uVar8);
      if (iVar4 == 0) {
        return 0;
      }
      goto LAB_0014d6c9;
    }
    if ((long)aiStack_398[0] < 1) {
LAB_0014d6b0:
      pcStack_3d8 = (code *)0x14d6b5;
      uv_free_interface_addresses();
      goto LAB_0014d5f6;
    }
    psVar9 = (short *)(alStack_338[0] + 0x14);
    uVar10 = 1;
    do {
      sVar2 = *psVar9;
      if (sVar2 == 10) break;
      psVar9 = psVar9 + 0x28;
      bVar16 = uVar10 < (ulong)(long)aiStack_398[0];
      uVar10 = uVar10 + 1;
    } while (bVar16);
    pcStack_3d8 = (code *)0x14d651;
    uv_free_interface_addresses();
    if (sVar2 != 10) goto LAB_0014d5f6;
    iVar5 = (int)alStack_338;
    pcStack_3d8 = (code *)0x14d667;
    iVar4 = uv_tcp_init(uVar8);
    if (iVar4 != 0) goto LAB_0014d6ce;
    iVar5 = 0x23a3;
    pcStack_3d8 = (code *)0x14d681;
    iVar4 = uv_ip6_addr("::",0x23a3,auStack_3b4);
    if (iVar4 == 0) {
      pcStack_3d8 = (code *)0x14d6a3;
      iVar5 = uv_tcp_connect(aiStack_398,alStack_338,auStack_3b4,connect_6);
      if (iVar5 != 0) {
        pcStack_3d8 = (code *)0x14d6b0;
        run_test_connect_unspecified_cold_6();
        goto LAB_0014d6b0;
      }
      goto LAB_0014d5f6;
    }
  }
  else {
    pcStack_3d8 = (code *)0x14d6bf;
    run_test_connect_unspecified_cold_1();
LAB_0014d6bf:
    pcStack_3d8 = (code *)0x14d6c4;
    run_test_connect_unspecified_cold_2();
LAB_0014d6c4:
    pcStack_3d8 = (code *)0x14d6c9;
    run_test_connect_unspecified_cold_3();
LAB_0014d6c9:
    pcStack_3d8 = (code *)0x14d6ce;
    run_test_connect_unspecified_cold_7();
LAB_0014d6ce:
    pcStack_3d8 = (code *)0x14d6d3;
    run_test_connect_unspecified_cold_4();
  }
  pcStack_3d8 = connect_4;
  run_test_connect_unspecified_cold_5();
  if (iVar5 != -99) {
    return extraout_EAX;
  }
  pcStack_3e0 = connect_6;
  connect_4_cold_1();
  if (iVar5 != -99) {
    return extraout_EAX_00;
  }
  pcStack_3e8 = run_test_connection_fail;
  connect_6_cold_1();
  pcVar12 = on_connect_with_close;
  pcStack_3f0 = (code *)0x14d6fd;
  pcStack_3e8 = (code *)uVar8;
  connection_fail(on_connect_with_close);
  if (timer_close_cb_calls == 0) {
    if (timer_cb_calls != 0) goto LAB_0014d74c;
    pcStack_3f0 = (code *)0x14d714;
    uVar8 = uv_default_loop();
    pcStack_3f0 = (code *)0x14d728;
    uv_walk(uVar8,close_walk_cb,0);
    pcStack_3f0 = (code *)0x14d732;
    uv_run(uVar8);
    pcStack_3f0 = (code *)0x14d737;
    pcVar12 = (code *)uv_default_loop();
    pcStack_3f0 = (code *)0x14d73f;
    iVar5 = uv_loop_close();
    if (iVar5 == 0) {
      return 0;
    }
  }
  else {
    pcStack_3f0 = (code *)0x14d74c;
    run_test_connection_fail_cold_1();
LAB_0014d74c:
    pcStack_3f0 = (code *)0x14d751;
    run_test_connection_fail_cold_2();
  }
  pcStack_3f0 = connection_fail;
  run_test_connection_fail_cold_3();
  pcVar13 = "0.0.0.0";
  iVar4 = 0;
  pcStack_3f0 = (code *)uVar8;
  iVar5 = uv_ip4_addr("0.0.0.0",0,auStack_400);
  if (iVar5 == 0) {
    puVar14 = (uv_connect_t *)0x194b4a;
    iVar4 = 0x23a3;
    iVar5 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_410);
    if (iVar5 != 0) goto LAB_0014d809;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar4 = 0x2dfbc0;
    iVar5 = uv_tcp_init();
    if (iVar5 != 0) goto LAB_0014d80e;
    puVar15 = &tcp;
    puVar11 = auStack_400;
    iVar5 = uv_tcp_bind(&tcp,puVar11,0);
    iVar4 = (int)puVar11;
    puVar14 = (uv_connect_t *)puVar15;
    if (iVar5 != 0) goto LAB_0014d813;
    puVar14 = &req;
    iVar4 = 0x2dfbc0;
    iVar5 = uv_tcp_connect(&req,&tcp,auStack_410,pcVar12);
    if (iVar5 != 0) goto LAB_0014d818;
    puVar14 = (uv_connect_t *)uv_default_loop();
    iVar4 = 0;
    iVar5 = uv_run();
    if (connect_cb_calls != 1) goto LAB_0014d81d;
    if (close_cb_calls == 1) {
      return iVar5;
    }
  }
  else {
    connection_fail_cold_1();
    puVar14 = (uv_connect_t *)pcVar13;
LAB_0014d809:
    connection_fail_cold_2();
LAB_0014d80e:
    connection_fail_cold_3();
LAB_0014d813:
    connection_fail_cold_4();
LAB_0014d818:
    connection_fail_cold_5();
LAB_0014d81d:
    connection_fail_cold_6();
  }
  connection_fail_cold_7();
  if ((uv_tcp_t *)(((uv_tcp_t *)puVar14)->u).reserved[3] == &tcp) {
    if (iVar4 != -0x6f) goto LAB_0014d862;
    connect_cb_calls = connect_cb_calls + 1;
    if (close_cb_calls == 0) {
      iVar5 = uv_close(&tcp,on_close);
      return iVar5;
    }
  }
  else {
    on_connect_with_close_cold_1();
LAB_0014d862:
    on_connect_with_close_cold_2();
  }
  on_connect_with_close_cold_3();
  uVar8 = uv_default_loop();
  iVar4 = 0x2dfb28;
  iVar5 = uv_timer_init(uVar8);
  if (iVar5 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014d8e0;
    if (timer_cb_calls == 1) {
      uVar8 = uv_default_loop();
      uv_walk(uVar8,close_walk_cb,0);
      iVar4 = 0;
      uv_run(uVar8);
      uVar8 = uv_default_loop();
      iVar5 = uv_loop_close(uVar8);
      if (iVar5 == 0) {
        return 0;
      }
      goto LAB_0014d8ea;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014d8e0:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014d8ea:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar4 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX_01;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_02;
}

Assistant:

TEST_IMPL(condvar_5) {
  worker_config wc;
  int r;
  /* ns */
  uint64_t before;
  uint64_t after;
  uint64_t elapsed;
  uint64_t timeout;

  timeout = 100 * 1000 * 1000; /* 100 ms in ns */

  /* Mostly irrelevant. We need cond and mutex initialized. */
  worker_config_init(&wc, 0, NULL, NULL);

  uv_mutex_lock(&wc.mutex);

  /* We wait.
   * No signaler, so this will only return if timeout is delivered. */
  before = uv_hrtime();
  r = uv_cond_timedwait(&wc.cond, &wc.mutex, timeout);
  after = uv_hrtime();

  uv_mutex_unlock(&wc.mutex);

  /* It timed out. */
  ASSERT(r == UV_ETIMEDOUT);

  /* It must have taken at least timeout, modulo system timer ticks.
   * But it should not take too much longer.
   * cf. MSDN docs:
   * https://msdn.microsoft.com/en-us/library/ms687069(VS.85).aspx */
  elapsed = after - before;
  ASSERT(0.75 * timeout <= elapsed); /* 1.0 too large for Windows. */
  ASSERT(elapsed <= 5.0 * timeout); /* MacOS has reported failures up to 1.75. */

  worker_config_destroy(&wc);

  return 0;
}